

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::convertToXYZ(float *out,float *whitepoint,uchar *in,uint w,uint h,LodePNGState *state)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  int in_ECX;
  long in_RDI;
  int in_R8D;
  long in_R9;
  float *gammatable_b;
  float *gammatable_g;
  float *gammatable_r;
  LodePNGICC icc;
  uint use_icc;
  LodePNGColorMode tempmode;
  size_t num;
  int bit16;
  float *gammatable;
  uchar *data;
  LodePNGInfo *info;
  LodePNGColorMode *mode_in;
  size_t n;
  size_t i;
  uint error;
  undefined8 in_stack_fffffffffffffe20;
  void *local_1d8;
  void *local_1d0;
  int local_1c8;
  LodePNGICC *in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe64;
  LodePNGInfo *in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  LodePNGInfo *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float *in_stack_fffffffffffffe88;
  uchar *in_stack_fffffffffffffe90;
  LodePNGICC *in_stack_fffffffffffffe98;
  float *in_stack_fffffffffffffea0;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  LodePNGColorMode *in_stack_ffffffffffffff10;
  LodePNGColorMode *in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff28;
  uint local_9c;
  ulong local_38;
  uint local_2c;
  
  bVar1 = 8 < *(uint *)(in_R9 + 0x9c);
  iVar2 = 0x100;
  if (bVar1) {
    iVar2 = 0x10000;
  }
  lodepng_color_mode_make
            ((LodePNGColorType)((ulong)in_stack_fffffffffffffe20 >> 0x20),
             (uint)in_stack_fffffffffffffe20);
  local_9c = 0;
  lodepng_icc_init((LodePNGICC *)0x13fd28);
  if (*(int *)(in_R9 + 0x1a8) != 0) {
    local_2c = parseICC(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                        (size_t)in_stack_fffffffffffffe88);
    if (local_2c != 0) goto LAB_001402b5;
    local_9c = validateICC((LodePNGICC *)&local_1c8);
  }
  pvVar3 = lodepng_malloc(0x13fdbb);
  local_2c = lodepng_convert(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (uint)in_stack_ffffffffffffff0c,(uint)in_stack_ffffffffffffff08);
  if (local_2c == 0) {
    if ((local_9c == 0) || (local_1c8 != 2)) {
      local_1d8 = lodepng_malloc(0x13ff33);
      pvVar4 = local_1d8;
      convertToXYZ_gamma_table
                ((float *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (size_t)in_stack_fffffffffffffe78,
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68,(uint)in_stack_fffffffffffffe64,in_stack_fffffffffffffe58
                );
      local_1d0 = local_1d8;
    }
    else {
      local_1d0 = lodepng_malloc(0x13fe39);
      local_1d8 = (void *)((long)local_1d0 + (long)iVar2 * 4);
      pvVar4 = (void *)((long)local_1d0 + (long)iVar2 * 8);
      convertToXYZ_gamma_table
                ((float *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (size_t)in_stack_fffffffffffffe78,
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68,(uint)in_stack_fffffffffffffe64,in_stack_fffffffffffffe58
                );
      convertToXYZ_gamma_table
                ((float *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (size_t)in_stack_fffffffffffffe78,
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68,(uint)in_stack_fffffffffffffe64,in_stack_fffffffffffffe58
                );
      convertToXYZ_gamma_table
                ((float *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (size_t)in_stack_fffffffffffffe78,
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68,(uint)in_stack_fffffffffffffe64,in_stack_fffffffffffffe58
                );
    }
    if (bVar1) {
      for (local_38 = 0; local_38 < (uint)(in_ECX * in_R8D); local_38 = local_38 + 1) {
        *(undefined4 *)(in_RDI + local_38 * 0x10) =
             *(undefined4 *)
              ((long)local_1d0 +
              (ulong)((uint)*(byte *)((long)pvVar3 + local_38 * 8) * 0x100 +
                     (uint)*(byte *)((long)pvVar3 + local_38 * 8 + 1)) * 4);
        *(undefined4 *)(in_RDI + 4 + local_38 * 0x10) =
             *(undefined4 *)
              ((long)local_1d8 +
              (ulong)((uint)*(byte *)((long)pvVar3 + local_38 * 8 + 2) * 0x100 +
                     (uint)*(byte *)((long)pvVar3 + local_38 * 8 + 3)) * 4);
        *(undefined4 *)(in_RDI + 8 + local_38 * 0x10) =
             *(undefined4 *)
              ((long)pvVar4 +
              (ulong)((uint)*(byte *)((long)pvVar3 + local_38 * 8 + 4) * 0x100 +
                     (uint)*(byte *)((long)pvVar3 + local_38 * 8 + 5)) * 4);
        *(float *)(in_RDI + 0xc + local_38 * 0x10) =
             (float)((uint)*(byte *)((long)pvVar3 + local_38 * 8 + 6) * 0x100 +
                    (uint)*(byte *)((long)pvVar3 + local_38 * 8 + 7)) * 1.5259022e-05;
      }
    }
    else {
      for (local_38 = 0; local_38 < (uint)(in_ECX * in_R8D); local_38 = local_38 + 1) {
        *(undefined4 *)(in_RDI + local_38 * 0x10) =
             *(undefined4 *)((long)local_1d0 + (ulong)*(byte *)((long)pvVar3 + local_38 * 4) * 4);
        *(undefined4 *)(in_RDI + 4 + local_38 * 0x10) =
             *(undefined4 *)
              ((long)local_1d8 + (ulong)*(byte *)((long)pvVar3 + local_38 * 4 + 1) * 4);
        *(undefined4 *)(in_RDI + 8 + local_38 * 0x10) =
             *(undefined4 *)((long)pvVar4 + (ulong)*(byte *)((long)pvVar3 + local_38 * 4 + 2) * 4);
        *(float *)(in_RDI + 0xc + local_38 * 0x10) =
             (float)*(byte *)((long)pvVar3 + local_38 * 4 + 3) * 0.003921569;
      }
    }
    convertToXYZ_chrm(in_stack_fffffffffffffe88,(uint)in_stack_fffffffffffffe84,
                      (uint)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                      (uint)in_stack_fffffffffffffe74,(LodePNGICC *)in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffea0);
  }
LAB_001402b5:
  lodepng_icc_cleanup((LodePNGICC *)0x1402bf);
  lodepng_free((void *)0x1402cc);
  lodepng_free((void *)0x1402d9);
  return local_2c;
}

Assistant:

unsigned convertToXYZ(float* out, float whitepoint[3], const unsigned char* in,
                      unsigned w, unsigned h, const LodePNGState* state) {
  unsigned error = 0;
  size_t i;
  size_t n = w * h;
  const LodePNGColorMode* mode_in = &state->info_raw;
  const LodePNGInfo* info = &state->info_png;
  unsigned char* data = 0;
  float* gammatable = 0;
  int bit16 = mode_in->bitdepth > 8;
  size_t num = bit16 ? 65536 : 256;
  LodePNGColorMode tempmode = lodepng_color_mode_make(LCT_RGBA, bit16 ? 16 : 8);


  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  data = (unsigned char*)lodepng_malloc(w * h * (bit16 ? 8 : 4));
  error = lodepng_convert(data, in, &tempmode, mode_in, w, h);
  if(error) goto cleanup;

  /* Handle transfer function */
  {
    float* gammatable_r;
    float* gammatable_g;
    float* gammatable_b;

    /* RGB ICC, can have three different transfer functions */
    if(use_icc && icc.inputspace == 2) {
      gammatable = (float*)lodepng_malloc(num * 3 * sizeof(float));
      gammatable_r = &gammatable[num * 0];
      gammatable_g = &gammatable[num * 1];
      gammatable_b = &gammatable[num * 2];
      convertToXYZ_gamma_table(gammatable_r, num, 0, info, use_icc, &icc);
      convertToXYZ_gamma_table(gammatable_g, num, 1, info, use_icc, &icc);
      convertToXYZ_gamma_table(gammatable_b, num, 2, info, use_icc, &icc);
    } else {
      gammatable = (float*)lodepng_malloc(num * sizeof(float));
      gammatable_r = gammatable_g = gammatable_b = gammatable;
      convertToXYZ_gamma_table(gammatable, num, 0, info, use_icc, &icc);
    }

    if(bit16) {
      for(i = 0; i < n; i++) {
        out[i * 4 + 0] = gammatable_r[data[i * 8 + 0] * 256u + data[i * 8 + 1]];
        out[i * 4 + 1] = gammatable_g[data[i * 8 + 2] * 256u + data[i * 8 + 3]];
        out[i * 4 + 2] = gammatable_b[data[i * 8 + 4] * 256u + data[i * 8 + 5]];
        out[i * 4 + 3] = (data[i * 8 + 6] * 256 + data[i * 8 + 7]) * (1 / 65535.0f);
      }
    } else {
      for(i = 0; i < n; i++) {
        out[i * 4 + 0] = gammatable_r[data[i * 4 + 0]];
        out[i * 4 + 1] = gammatable_g[data[i * 4 + 1]];
        out[i * 4 + 2] = gammatable_b[data[i * 4 + 2]];
        out[i * 4 + 3] = data[i * 4 + 3] * (1 / 255.0f);
      }
    }
  }

  convertToXYZ_chrm(out, w, h, info, use_icc, &icc, whitepoint);

cleanup:
  lodepng_icc_cleanup(&icc);
  lodepng_free(data);
  lodepng_free(gammatable);
  return error;
}